

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O1

void duckdb::ApproxQuantileListOperation<long>::
     Finalize<duckdb::list_entry_t,duckdb::ApproxQuantileState>
               (ApproxQuantileState *state,list_entry_t *target,AggregateFinalizeData *finalize_data
               )

{
  AggregateInputData *this;
  FunctionData *pFVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  uint64_t uVar5;
  reference pvVar6;
  undefined8 uVar7;
  long lVar8;
  ulong uVar9;
  size_type __n;
  Value VVar10;
  undefined8 local_40;
  
  if (state->pos != 0) {
    this = finalize_data->input;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
    pFVar1 = (this->bind_data).ptr;
    lVar4 = duckdb::ListVector::GetEntry(finalize_data->result);
    uVar5 = duckdb::ListVector::GetListSize(finalize_data->result);
    duckdb::ListVector::Reserve
              (finalize_data->result,(*(long *)(pFVar1 + 0x10) - *(long *)(pFVar1 + 8) >> 2) + uVar5
              );
    lVar4 = *(long *)(lVar4 + 0x20);
    duckdb_tdigest::TDigest::process(state->h);
    target->offset = uVar5;
    lVar8 = *(long *)(pFVar1 + 0x10);
    lVar2 = *(long *)(pFVar1 + 8);
    uVar9 = lVar8 - lVar2 >> 2;
    target->length = uVar9;
    if (lVar8 != lVar2) {
      lVar4 = lVar4 + uVar5 * 8;
      lVar8 = 0;
      local_40 = 0x8000000000000000;
      __n = 0;
      do {
        pvVar6 = vector<float,_true>::operator[]((vector<float,_true> *)(pFVar1 + 8),__n);
        VVar10 = duckdb_tdigest::TDigest::quantile(state->h,(double)*pvVar6);
        bVar3 = duckdb::TryCast::Operation<double,long>(VVar10,(long *)(lVar4 + lVar8),false);
        if (!bVar3) {
          uVar7 = 0x7fffffffffffffff;
          if (VVar10 < 0.0) {
            uVar7 = local_40;
          }
          *(undefined8 *)(lVar4 + __n * 8) = uVar7;
        }
        __n = __n + 1;
        uVar9 = target->length;
        lVar8 = lVar8 + 8;
      } while (__n < uVar9);
    }
    duckdb::ListVector::SetListSize(finalize_data->result,uVar9 + target->offset);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, RESULT_TYPE &target, AggregateFinalizeData &finalize_data) {
		if (state.pos == 0) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->template Cast<ApproximateQuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		D_ASSERT(state.h);
		state.h->compress();

		auto &entry = target;
		entry.offset = ridx;
		entry.length = bind_data.quantiles.size();
		for (size_t q = 0; q < entry.length; ++q) {
			const auto &quantile = bind_data.quantiles[q];
			const auto &source = state.h->quantile(quantile);
			auto &target = rdata[ridx + q];
			ApproxQuantileCoding::Decode(source, target);
		}

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}